

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort_mkq.cpp
# Opt level: O2

void burstsort_mkq_simpleburst_4(uchar **strings,size_t N)

{
  uint *__ptr;
  uint uVar1;
  uint32_t uVar2;
  _Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *p_Var3;
  TSTNode<unsigned_int> *pTVar4;
  uint uVar5;
  pointer ppuVar6;
  size_t sVar7;
  size_t depth;
  ulong uVar8;
  pointer ppuVar9;
  BurstSimple<unsigned_int> local_91;
  TSTNode<unsigned_int> *local_90;
  _Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *local_88;
  uchar **local_80;
  uint *local_78;
  uchar *str;
  size_t local_68;
  size_t local_60;
  TSTNode<unsigned_int> root;
  
  TSTNode<unsigned_int>::TSTNode(&root);
  sVar7 = 0;
  local_80 = strings;
  local_68 = N;
  root.pivot = pseudo_median<unsigned_int>(strings,N,0);
  while( true ) {
    if (sVar7 == local_68) break;
    str = local_80[sVar7];
    uVar1 = get_char<unsigned_int>(str,0);
    pTVar4 = &root;
    depth = 0;
    while( true ) {
      uVar5 = pTVar4->pivot;
      uVar5 = (uint)(uVar1 == uVar5) + (uint)(uVar5 <= uVar1 && uVar1 != uVar5) * 2;
      if (((uint)(pTVar4->is_tst).super__Base_bitset<1UL>._M_w >> uVar5 & 1) == 0) break;
      if (uVar5 == 1) {
        depth = depth + 4;
        uVar1 = get_char<unsigned_int>(str,depth);
      }
      pTVar4 = (TSTNode<unsigned_int> *)(pTVar4->buckets)._M_elems[uVar5];
    }
    p_Var3 = (_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
             (pTVar4->buckets)._M_elems[uVar5];
    local_60 = sVar7;
    if (p_Var3 == (_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)0x0) {
      p_Var3 = (_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)operator_new(0x18)
      ;
      (((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&p_Var3->_M_impl)->
      _M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
      (((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&p_Var3->_M_impl)->
      _M_impl).super__Vector_impl_data._M_finish = (pointer)0x0;
      (((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&p_Var3->_M_impl)->
      _M_impl).super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pTVar4->buckets)._M_elems[uVar5] = p_Var3;
    }
    local_88 = p_Var3;
    std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back
              ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)p_Var3,&str);
    if ((uVar5 != 1) || ((char)pTVar4->pivot != '\0')) {
      ppuVar9 = (((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
                 &local_88->_M_impl)->_M_impl).super__Vector_impl_data._M_start;
      ppuVar6 = (((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
                 &local_88->_M_impl)->_M_impl).super__Vector_impl_data._M_finish;
      if ((0x40000 < (ulong)((long)ppuVar6 - (long)ppuVar9)) &&
         (ppuVar6 ==
          (((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&local_88->_M_impl)->
          _M_impl).super__Vector_impl_data._M_end_of_storage)) {
        local_90 = (TSTNode<unsigned_int> *)(depth + 4);
        if (uVar5 != 1) {
          local_90 = (TSTNode<unsigned_int> *)depth;
        }
        local_78 = (uint *)malloc((long)ppuVar6 - (long)ppuVar9 >> 1);
        for (uVar1 = 0; uVar8 = (ulong)uVar1, uVar8 < (ulong)((long)ppuVar6 - (long)ppuVar9 >> 3);
            uVar1 = uVar1 + 1) {
          uVar2 = get_char<unsigned_int>(ppuVar9[uVar8],(size_t)local_90);
          local_78[uVar8] = uVar2;
          ppuVar9 = (((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
                     &local_88->_M_impl)->_M_impl).super__Vector_impl_data._M_start;
          ppuVar6 = (((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
                     &local_88->_M_impl)->_M_impl).super__Vector_impl_data._M_finish;
        }
        verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_int>(&root,0)
        ;
        __ptr = local_78;
        p_Var3 = local_88;
        local_90 = BurstSimple<unsigned_int>::operator()
                             (&local_91,
                              (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)local_88,
                              local_78,(size_t)local_90);
        free(__ptr);
        std::_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~_Vector_base(p_Var3);
        operator_delete(p_Var3);
        (pTVar4->buckets)._M_elems[uVar5] = local_90;
        (pTVar4->is_tst).super__Base_bitset<1UL>._M_w =
             (pTVar4->is_tst).super__Base_bitset<1UL>._M_w | 1L << (sbyte)uVar5;
        verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_int>(&root,0)
        ;
      }
    }
    sVar7 = local_60 + 1;
  }
  verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_int>(&root,0);
  burst_traverse<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_int>
            (&root,local_80,0,0);
  return;
}

Assistant:

void burstsort_mkq_simpleburst_4(unsigned char** strings, size_t N)
{ burstsort_mkq_simpleburst<uint32_t>(strings, N); }